

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_ce.cpp
# Opt level: O1

void msd_CE5(uchar **strings,size_t n,size_t depth,uint16_t *oracle,uchar **sorted)

{
  uchar *puVar1;
  size_t sVar2;
  size_t i;
  size_t sVar3;
  long *__ptr;
  uint16_t uVar4;
  long lVar5;
  size_t i_2;
  long lVar6;
  
  if (n < 0x10000) {
    msd_CE2_16bit_5(strings,n,depth,(uchar *)oracle,sorted);
    return;
  }
  sVar3 = 0;
  do {
    puVar1 = strings[sVar3];
    if (puVar1 == (uchar *)0x0) {
      __assert_fail("ptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                    ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
    }
    if (puVar1[depth] == '\0') {
      uVar4 = 0;
    }
    else {
      uVar4 = CONCAT11(puVar1[depth],puVar1[depth + 1]);
    }
    oracle[sVar3] = uVar4;
    sVar3 = sVar3 + 1;
  } while (n != sVar3);
  __ptr = (long *)calloc(0x10000,8);
  sVar3 = 0;
  do {
    __ptr[oracle[sVar3]] = __ptr[oracle[sVar3]] + 1;
    sVar3 = sVar3 + 1;
  } while (n != sVar3);
  msd_CE5::bucketindex[0] = 0;
  lVar5 = 0;
  sVar3 = 0;
  do {
    sVar3 = sVar3 + __ptr[lVar5];
    msd_CE5::bucketindex[lVar5 + 1] = sVar3;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xffff);
  sVar3 = 0;
  do {
    puVar1 = strings[sVar3];
    sVar2 = msd_CE5::bucketindex[oracle[sVar3]];
    msd_CE5::bucketindex[oracle[sVar3]] = sVar2 + 1;
    sorted[sVar2] = puVar1;
    sVar3 = sVar3 + 1;
  } while (n != sVar3);
  memcpy(strings,sorted,n << 3);
  lVar5 = *__ptr;
  lVar6 = 1;
  do {
    sVar3 = __ptr[lVar6];
    if (sVar3 != 0) {
      if ((char)lVar6 != '\0') {
        msd_CE5(strings + lVar5,sVar3,depth + 2,oracle,sorted);
      }
      lVar5 = lVar5 + sVar3;
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x10000);
  free(__ptr);
  return;
}

Assistant:

static void
msd_CE5(unsigned char** strings, size_t n, size_t depth,
		uint16_t* oracle, unsigned char** sorted)
{
	if (n < 0x10000) {
		msd_CE2_16bit_5(strings, n, depth,
			(unsigned char*)oracle, sorted);
		return;
	}
	for (size_t i=0; i < n; ++i)
		oracle[i] = get_char<uint16_t>(strings[i], depth);
	size_t* restrict bucketsize = (size_t*)
		calloc(0x10000, sizeof(size_t));
	for (size_t i=0; i < n; ++i)
		++bucketsize[oracle[i]];
	static size_t bucketindex[0x10000];
	bucketindex[0] = 0;
	for (size_t i=1; i < 0x10000; ++i)
		bucketindex[i] = bucketindex[i-1]+bucketsize[i-1];
	for (size_t i=0; i < n; ++i)
		sorted[bucketindex[oracle[i]]++] = strings[i];
	memcpy(strings, sorted, n*sizeof(unsigned char*));
	size_t bsum = bucketsize[0];
	for (size_t i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_CE5(strings+bsum, bucketsize[i],
				depth+2, oracle, sorted);
		bsum += bucketsize[i];
	}
	free(bucketsize);
}